

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerImpl::SignRequest
          (Error *__return_storage_ptr__,CommissionerImpl *this,Request *aRequest,Scope aScope,
          bool aAppendToken)

{
  ErrorCode EVar1;
  int iVar2;
  Error *pEVar3;
  ByteArray signature;
  Tlv local_78;
  undefined1 local_58 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
  if ((char)iVar2 == '\0') {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp"
                  ,0x5a0,
                  "Error ot::commissioner::CommissionerImpl::SignRequest(coap::Request &, tlv::Scope, bool)"
                 );
  }
  TokenManager::SignMessage((Error *)local_58,&this->mTokenManager,&signature,aRequest);
  pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_58);
  EVar1 = pEVar3->mCode;
  std::__cxx11::string::~string((string *)(local_58 + 8));
  if (EVar1 == kNone) {
    if (aAppendToken) {
      tlv::Tlv::Tlv(&local_78,kCommissionerToken,&(this->mTokenManager).mSignedToken,aScope);
      AppendTlv((Error *)local_58,aRequest,&local_78);
      pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_58);
      EVar1 = pEVar3->mCode;
      std::__cxx11::string::~string((string *)(local_58 + 8));
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&local_78.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
      ;
      if (EVar1 != kNone) goto LAB_00194197;
    }
    tlv::Tlv::Tlv(&local_78,kCommissionerSignature,&signature,aScope);
    AppendTlv((Error *)local_58,aRequest,&local_78);
    Error::operator=(__return_storage_ptr__,(Error *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_78.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
LAB_00194197:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::SignRequest(coap::Request &aRequest, tlv::Scope aScope, bool aAppendToken)
{
    Error     error;
    ByteArray signature;

    ASSERT(IsCcmMode());

    SuccessOrExit(error = mTokenManager.SignMessage(signature, aRequest));

    if (aAppendToken)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kCommissionerToken, mTokenManager.GetToken(), aScope}));
    }
    SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kCommissionerSignature, signature, aScope}));

exit:
    return error;
}